

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiMouseButton mouse_button)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID id;
  
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  if (str_id == (char *)0x0) {
    id = (this->DC).LastItemId;
  }
  else {
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  }
  if (id != 0) {
    bVar1 = IsMouseReleased(mouse_button);
    if (bVar1) {
      bVar1 = IsItemHovered(8);
      if (bVar1) {
        OpenPopupEx(id);
      }
    }
    bVar1 = BeginPopupEx(id,0x141);
    return bVar1;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                ,0x1e69,"bool ImGui::BeginPopupContextItem(const char *, ImGuiMouseButton)");
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiMouseButton mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}